

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LockFreeCallbackDispatcher.hpp
# Opt level: O0

void __thiscall
ableton::platforms::
LockFreeCallbackDispatcher<std::function<void_()>,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
::run(LockFreeCallbackDispatcher<std::function<void_()>,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
      *this)

{
  bool bVar1;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  LockFreeCallbackDispatcher<std::function<void_()>,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
  *this_local;
  
  lock._8_8_ = this;
  while( true ) {
    bVar1 = std::atomic<bool>::load(&this->mRunning,memory_order_seq_cst);
    if (!bVar1) break;
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->mMutex);
    std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
              (&this->mCondition,(unique_lock<std::mutex> *)local_20,&this->mFallbackPeriod);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
    std::function<void_()>::operator()(&this->mCallback);
  }
  return;
}

Assistant:

void run()
  {
    while (mRunning.load())
    {
      {
        std::unique_lock<std::mutex> lock(mMutex);
        mCondition.wait_for(lock, mFallbackPeriod);
      }
      mCallback();
    }
  }